

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# B3DImporter.cpp
# Opt level: O0

string * __thiscall
Assimp::B3DImporter::ReadChunk_abi_cxx11_(string *__return_storage_ptr__,B3DImporter *this)

{
  int iVar1;
  value_type_conflict3 local_34;
  int local_30;
  uint sz;
  int local_20;
  undefined1 local_19;
  int i;
  B3DImporter *this_local;
  string *tag;
  
  local_19 = 0;
  _i = this;
  this_local = (B3DImporter *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  for (local_20 = 0; local_20 < 4; local_20 = local_20 + 1) {
    iVar1 = ReadByte(this);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(char)iVar1);
  }
  local_30 = ReadInt(this);
  local_34 = this->_pos + local_30;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&this->_stack,&local_34);
  return __return_storage_ptr__;
}

Assistant:

string B3DImporter::ReadChunk(){
    string tag;
    for( int i=0;i<4;++i ){
        tag+=char( ReadByte() );
    }
#ifdef DEBUG_B3D
//	cout<<"ReadChunk:"<<tag<<endl;
#endif
    unsigned sz=(unsigned)ReadInt();
    _stack.push_back( _pos+sz );
    return tag;
}